

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdl2.cpp
# Opt level: O0

int E64::sdl2_process_events(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  bool alt_pressed;
  bool shift_pressed;
  SDL_Event event;
  int return_value;
  undefined6 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd6;
  char in_stack_fffffffffffffcd7;
  undefined6 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce6;
  char in_stack_fffffffffffffce7;
  char local_309;
  char local_2f9;
  char local_2e9;
  char local_2d9;
  char local_2c9;
  char local_2b9;
  char local_2a9;
  tty_t *in_stack_fffffffffffffd58;
  undefined6 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd66;
  char in_stack_fffffffffffffd67;
  fd_t *in_stack_fffffffffffffd68;
  char local_289;
  char local_279;
  char local_269;
  char local_259;
  char local_249;
  char local_239;
  char local_229;
  char local_219;
  char local_209;
  char local_1f9;
  char local_1e9;
  char local_1d9;
  char local_1c9;
  char local_1b9;
  char local_1a9;
  char local_199;
  char local_189;
  char local_179;
  char local_169;
  char local_159;
  char local_149;
  char local_139;
  char local_129;
  char local_119;
  char local_109;
  char local_f9;
  char local_e9;
  char local_d9;
  char local_c9;
  char local_b9;
  char local_a9;
  char local_99;
  char local_89;
  char local_79;
  char local_69;
  char local_59;
  char local_4d;
  int local_40 [2];
  undefined4 local_38;
  undefined4 uStack_34;
  int local_2c;
  int local_4;
  
  local_4 = 0;
  bVar1 = E64_sdl2_keyboard_state[0xe1] == '\0';
  bVar2 = E64_sdl2_keyboard_state[0xe5] == '\0';
  bVar3 = E64_sdl2_keyboard_state[0xe2] == '\0';
  bVar4 = E64_sdl2_keyboard_state[0xe6] == '\0';
  while (iVar5 = SDL_PollEvent(local_40), iVar5 != 0) {
    if (local_40[0] == 0x100) {
      local_4 = -1;
    }
    else if (local_40[0] == 0x200) {
      if ((char)uStack_34 == '\x05') {
        printf("[SDL] window resize event\n");
      }
    }
    else if (local_40[0] == 0x300) {
      local_4 = 1;
      if (local_2c == 0x40000042) {
        sdl2_wait_until_f9_released();
        machine_t::toggle_mode
                  ((machine_t *)
                   CONCAT17(in_stack_fffffffffffffcd7,
                            CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)));
      }
      else if ((local_2c != 0x66) || (bVar3 && bVar4)) {
        if ((local_2c != 0x72) || (bVar3 && bVar4)) {
          if ((local_2c != 0x71) || (bVar3 && bVar4)) {
            if (machine.mode == RUNNING) {
              if (local_2c == 0x40000043) {
                vicv_ic::toggle_stats(machine.vicv);
              }
            }
            else if (machine.mode == MONITOR) {
              if (local_2c == 8) {
                if (bVar1 && bVar2) {
                  tty_t::backspace((tty_t *)CONCAT17(in_stack_fffffffffffffcd7,
                                                     CONCAT16(in_stack_fffffffffffffcd6,
                                                              in_stack_fffffffffffffcd0)));
                }
                else {
                  tty_t::insert((tty_t *)CONCAT17(in_stack_fffffffffffffcd7,
                                                  CONCAT16(in_stack_fffffffffffffcd6,
                                                           in_stack_fffffffffffffcd0)));
                }
              }
              else if (local_2c == 0xd) {
                tty_t::enter((tty_t *)CONCAT17(in_stack_fffffffffffffce7,
                                               CONCAT16(in_stack_fffffffffffffce6,
                                                        in_stack_fffffffffffffce0)));
              }
              else if (local_2c == 0x20) {
                tty_t::putchar(monitor.tty,0x20);
              }
              else if (local_2c == 0x27) {
                local_2d9 = '\"';
                if (bVar1 && bVar2) {
                  local_2d9 = '\'';
                }
                tty_t::putchar(monitor.tty,(int)local_2d9);
              }
              else if (local_2c == 0x2c) {
                in_stack_fffffffffffffd66 = 0x2c;
                in_stack_fffffffffffffd67 = '<';
                if (bVar1 && bVar2) {
                  in_stack_fffffffffffffd67 = ',';
                }
                in_stack_fffffffffffffd58 = monitor.tty;
                tty_t::putchar(monitor.tty,(int)in_stack_fffffffffffffd67);
              }
              else if (local_2c == 0x2d) {
                in_stack_fffffffffffffce6 = 0x2d;
                in_stack_fffffffffffffce7 = '_';
                if (bVar1 && bVar2) {
                  in_stack_fffffffffffffce7 = '-';
                }
                tty_t::putchar(monitor.tty,(int)in_stack_fffffffffffffce7);
              }
              else if (local_2c == 0x2e) {
                local_2a9 = '>';
                if (bVar1 && bVar2) {
                  local_2a9 = '.';
                }
                tty_t::putchar(monitor.tty,(int)local_2a9);
              }
              else if (local_2c == 0x2f) {
                local_2b9 = '?';
                if (bVar1 && bVar2) {
                  local_2b9 = '/';
                }
                tty_t::putchar(monitor.tty,(int)local_2b9);
              }
              else if (local_2c == 0x30) {
                local_4d = ')';
                if (bVar1 && bVar2) {
                  local_4d = '0';
                }
                tty_t::putchar(monitor.tty,(int)local_4d);
              }
              else if (local_2c == 0x31) {
                local_59 = '!';
                if (bVar1 && bVar2) {
                  local_59 = '1';
                }
                tty_t::putchar(monitor.tty,(int)local_59);
              }
              else if (local_2c == 0x32) {
                local_69 = '@';
                if (bVar1 && bVar2) {
                  local_69 = '2';
                }
                tty_t::putchar(monitor.tty,(int)local_69);
              }
              else if (local_2c == 0x33) {
                local_79 = '#';
                if (bVar1 && bVar2) {
                  local_79 = '3';
                }
                tty_t::putchar(monitor.tty,(int)local_79);
              }
              else if (local_2c == 0x34) {
                local_89 = '$';
                if (bVar1 && bVar2) {
                  local_89 = '4';
                }
                tty_t::putchar(monitor.tty,(int)local_89);
              }
              else if (local_2c == 0x35) {
                local_99 = '%';
                if (bVar1 && bVar2) {
                  local_99 = '5';
                }
                tty_t::putchar(monitor.tty,(int)local_99);
              }
              else if (local_2c == 0x36) {
                local_a9 = '^';
                if (bVar1 && bVar2) {
                  local_a9 = '6';
                }
                tty_t::putchar(monitor.tty,(int)local_a9);
              }
              else if (local_2c == 0x37) {
                local_b9 = '&';
                if (bVar1 && bVar2) {
                  local_b9 = '7';
                }
                tty_t::putchar(monitor.tty,(int)local_b9);
              }
              else if (local_2c == 0x38) {
                local_c9 = '*';
                if (bVar1 && bVar2) {
                  local_c9 = '8';
                }
                tty_t::putchar(monitor.tty,(int)local_c9);
              }
              else if (local_2c == 0x39) {
                local_d9 = '(';
                if (bVar1 && bVar2) {
                  local_d9 = '9';
                }
                tty_t::putchar(monitor.tty,(int)local_d9);
              }
              else if (local_2c == 0x3b) {
                local_2c9 = ':';
                if (bVar1 && bVar2) {
                  local_2c9 = ';';
                }
                tty_t::putchar(monitor.tty,(int)local_2c9);
              }
              else if (local_2c == 0x3d) {
                in_stack_fffffffffffffcd6 = 0x3d;
                in_stack_fffffffffffffcd7 = '+';
                if (bVar1 && bVar2) {
                  in_stack_fffffffffffffcd7 = '=';
                }
                tty_t::putchar(monitor.tty,(int)in_stack_fffffffffffffcd7);
              }
              else if (local_2c == 0x5b) {
                local_2f9 = '{';
                if (bVar1 && bVar2) {
                  local_2f9 = '[';
                }
                tty_t::putchar(monitor.tty,(int)local_2f9);
              }
              else if (local_2c == 0x5c) {
                local_2e9 = '|';
                if (bVar1 && bVar2) {
                  local_2e9 = '\\';
                }
                tty_t::putchar(monitor.tty,(int)local_2e9);
              }
              else if (local_2c == 0x5d) {
                local_309 = '}';
                if (bVar1 && bVar2) {
                  local_309 = ']';
                }
                tty_t::putchar(monitor.tty,(int)local_309);
              }
              else if (local_2c == 0x60) {
                local_289 = '~';
                if (bVar1 && bVar2) {
                  local_289 = '`';
                }
                in_stack_fffffffffffffd68 = (fd_t *)monitor.tty;
                tty_t::putchar(monitor.tty,(int)local_289);
              }
              else if (local_2c == 0x61) {
                local_e9 = 'A';
                if (bVar1 && bVar2) {
                  local_e9 = 'a';
                }
                tty_t::putchar(monitor.tty,(int)local_e9);
              }
              else if (local_2c == 0x62) {
                local_f9 = 'B';
                if (bVar1 && bVar2) {
                  local_f9 = 'b';
                }
                tty_t::putchar(monitor.tty,(int)local_f9);
              }
              else if (local_2c == 99) {
                local_109 = 'C';
                if (bVar1 && bVar2) {
                  local_109 = 'c';
                }
                tty_t::putchar(monitor.tty,(int)local_109);
              }
              else if (local_2c == 100) {
                local_119 = 'D';
                if (bVar1 && bVar2) {
                  local_119 = 'd';
                }
                tty_t::putchar(monitor.tty,(int)local_119);
              }
              else if (local_2c == 0x65) {
                local_129 = 'E';
                if (bVar1 && bVar2) {
                  local_129 = 'e';
                }
                tty_t::putchar(monitor.tty,(int)local_129);
              }
              else if (local_2c == 0x66) {
                local_139 = 'F';
                if (bVar1 && bVar2) {
                  local_139 = 'f';
                }
                tty_t::putchar(monitor.tty,(int)local_139);
              }
              else if (local_2c == 0x67) {
                local_149 = 'G';
                if (bVar1 && bVar2) {
                  local_149 = 'g';
                }
                tty_t::putchar(monitor.tty,(int)local_149);
              }
              else if (local_2c == 0x68) {
                local_159 = 'H';
                if (bVar1 && bVar2) {
                  local_159 = 'h';
                }
                tty_t::putchar(monitor.tty,(int)local_159);
              }
              else if (local_2c == 0x69) {
                local_169 = 'I';
                if (bVar1 && bVar2) {
                  local_169 = 'i';
                }
                tty_t::putchar(monitor.tty,(int)local_169);
              }
              else if (local_2c == 0x6a) {
                local_179 = 'J';
                if (bVar1 && bVar2) {
                  local_179 = 'j';
                }
                tty_t::putchar(monitor.tty,(int)local_179);
              }
              else if (local_2c == 0x6b) {
                local_189 = 'K';
                if (bVar1 && bVar2) {
                  local_189 = 'k';
                }
                tty_t::putchar(monitor.tty,(int)local_189);
              }
              else if (local_2c == 0x6c) {
                local_199 = 'L';
                if (bVar1 && bVar2) {
                  local_199 = 'l';
                }
                tty_t::putchar(monitor.tty,(int)local_199);
              }
              else if (local_2c == 0x6d) {
                local_1a9 = 'M';
                if (bVar1 && bVar2) {
                  local_1a9 = 'm';
                }
                tty_t::putchar(monitor.tty,(int)local_1a9);
              }
              else if (local_2c == 0x6e) {
                local_1b9 = 'N';
                if (bVar1 && bVar2) {
                  local_1b9 = 'n';
                }
                tty_t::putchar(monitor.tty,(int)local_1b9);
              }
              else if (local_2c == 0x6f) {
                local_1c9 = 'O';
                if (bVar1 && bVar2) {
                  local_1c9 = 'o';
                }
                tty_t::putchar(monitor.tty,(int)local_1c9);
              }
              else if (local_2c == 0x70) {
                local_1d9 = 'P';
                if (bVar1 && bVar2) {
                  local_1d9 = 'p';
                }
                tty_t::putchar(monitor.tty,(int)local_1d9);
              }
              else if (local_2c == 0x71) {
                local_1e9 = 'Q';
                if (bVar1 && bVar2) {
                  local_1e9 = 'q';
                }
                tty_t::putchar(monitor.tty,(int)local_1e9);
              }
              else if (local_2c == 0x72) {
                local_1f9 = 'R';
                if (bVar1 && bVar2) {
                  local_1f9 = 'r';
                }
                tty_t::putchar(monitor.tty,(int)local_1f9);
              }
              else if (local_2c == 0x73) {
                local_209 = 'S';
                if (bVar1 && bVar2) {
                  local_209 = 's';
                }
                tty_t::putchar(monitor.tty,(int)local_209);
              }
              else if (local_2c == 0x74) {
                local_219 = 'T';
                if (bVar1 && bVar2) {
                  local_219 = 't';
                }
                tty_t::putchar(monitor.tty,(int)local_219);
              }
              else if (local_2c == 0x75) {
                local_229 = 'U';
                if (bVar1 && bVar2) {
                  local_229 = 'u';
                }
                tty_t::putchar(monitor.tty,(int)local_229);
              }
              else if (local_2c == 0x76) {
                local_239 = 'V';
                if (bVar1 && bVar2) {
                  local_239 = 'v';
                }
                tty_t::putchar(monitor.tty,(int)local_239);
              }
              else if (local_2c == 0x77) {
                local_249 = 'W';
                if (bVar1 && bVar2) {
                  local_249 = 'w';
                }
                tty_t::putchar(monitor.tty,(int)local_249);
              }
              else if (local_2c == 0x78) {
                local_259 = 'X';
                if (bVar1 && bVar2) {
                  local_259 = 'x';
                }
                tty_t::putchar(monitor.tty,(int)local_259);
              }
              else if (local_2c == 0x79) {
                local_269 = 'Y';
                if (bVar1 && bVar2) {
                  local_269 = 'y';
                }
                tty_t::putchar(monitor.tty,(int)local_269);
              }
              else if (local_2c == 0x7a) {
                local_279 = 'Z';
                if (bVar1 && bVar2) {
                  local_279 = 'z';
                }
                tty_t::putchar(monitor.tty,(int)local_279);
              }
              else if (local_2c == 0x4000003a) {
                command_t::single_step_cpu((command_t *)0x17a488);
                if (((monitor.tty)->status_bar_active & 1U) == 0) {
                  tty_t::cursor_deactivate(monitor.tty);
                  command_t::dump_cpu_status((command_t *)0x17a4c0);
                  tty_t::prompt((tty_t *)0x17a4d0);
                  tty_t::cursor_activate(monitor.tty);
                }
              }
              else if (local_2c == 0x4000003b) {
                tty_t::toggle_status_bar
                          ((tty_t *)CONCAT17(in_stack_fffffffffffffcd7,
                                             CONCAT16(in_stack_fffffffffffffcd6,
                                                      in_stack_fffffffffffffcd0)));
              }
              else if (local_2c == 0x4000003c) {
                (monitor.tty)->status_bar_hex_view =
                     (bool)(((monitor.tty)->status_bar_hex_view ^ 0xffU) & 1);
              }
              else if (local_2c == 0x4000004f) {
                tty_t::arrow_right((tty_t *)CONCAT17(in_stack_fffffffffffffcd7,
                                                     CONCAT16(in_stack_fffffffffffffcd6,
                                                              in_stack_fffffffffffffcd0)));
              }
              else if (local_2c == 0x40000050) {
                tty_t::arrow_left((tty_t *)CONCAT17(in_stack_fffffffffffffcd7,
                                                    CONCAT16(in_stack_fffffffffffffcd6,
                                                             in_stack_fffffffffffffcd0)));
              }
              else if (local_2c == 0x40000051) {
                tty_t::arrow_down((tty_t *)CONCAT17(in_stack_fffffffffffffce7,
                                                    CONCAT16(in_stack_fffffffffffffce6,
                                                             in_stack_fffffffffffffce0)));
              }
              else if (local_2c == 0x40000052) {
                tty_t::arrow_up((tty_t *)CONCAT17(in_stack_fffffffffffffce7,
                                                  CONCAT16(in_stack_fffffffffffffce6,
                                                           in_stack_fffffffffffffce0)));
              }
            }
          }
          else {
            sdl2_wait_until_q_released();
            local_4 = -1;
          }
        }
        else {
          sdl2_wait_until_r_released();
          machine_t::reset((machine_t *)
                           CONCAT17(in_stack_fffffffffffffcd7,
                                    CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)));
          stats_t::reset((stats_t *)
                         CONCAT17(in_stack_fffffffffffffcd7,
                                  CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)));
        }
      }
      else {
        sdl2_wait_until_f_released();
        video_t::toggle_fullscreen
                  ((video_t *)
                   CONCAT17(in_stack_fffffffffffffcd7,
                            CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)));
      }
    }
    else if (local_40[0] == 0x1000) {
      fd_t::insert_disk(in_stack_fffffffffffffd68,
                        (char *)CONCAT17(in_stack_fffffffffffffd67,
                                         CONCAT16(in_stack_fffffffffffffd66,
                                                  in_stack_fffffffffffffd60)),
                        SUB81((ulong)in_stack_fffffffffffffd58 >> 0x38,0),
                        SUB81((ulong)in_stack_fffffffffffffd58 >> 0x30,0));
      SDL_free(CONCAT44(uStack_34,local_38));
    }
  }
  if (bVar3 && bVar4) {
    (machine.cia)->keys_last_known_state[1] = E64_sdl2_keyboard_state[0x29] != '\0';
    (machine.cia)->keys_last_known_state[2] = E64_sdl2_keyboard_state[0x3a] != '\0';
    (machine.cia)->keys_last_known_state[3] = E64_sdl2_keyboard_state[0x3b] != '\0';
    (machine.cia)->keys_last_known_state[4] = E64_sdl2_keyboard_state[0x3c] != '\0';
    (machine.cia)->keys_last_known_state[5] = E64_sdl2_keyboard_state[0x3d] != '\0';
    (machine.cia)->keys_last_known_state[6] = E64_sdl2_keyboard_state[0x3e] != '\0';
    (machine.cia)->keys_last_known_state[7] = E64_sdl2_keyboard_state[0x3f] != '\0';
    (machine.cia)->keys_last_known_state[8] = E64_sdl2_keyboard_state[0x40] != '\0';
    (machine.cia)->keys_last_known_state[9] = E64_sdl2_keyboard_state[0x41] != '\0';
    (machine.cia)->keys_last_known_state[10] =
         (machine.cia)->registers[10] << 1 | E64_sdl2_keyboard_state[0x35] != '\0';
    (machine.cia)->keys_last_known_state[0xb] = E64_sdl2_keyboard_state[0x1e] != '\0';
    (machine.cia)->keys_last_known_state[0xc] = E64_sdl2_keyboard_state[0x1f] != '\0';
    (machine.cia)->keys_last_known_state[0xd] = E64_sdl2_keyboard_state[0x20] != '\0';
    (machine.cia)->keys_last_known_state[0xe] = E64_sdl2_keyboard_state[0x21] != '\0';
    (machine.cia)->keys_last_known_state[0xf] = E64_sdl2_keyboard_state[0x22] != '\0';
    (machine.cia)->keys_last_known_state[0x10] = E64_sdl2_keyboard_state[0x23] != '\0';
    (machine.cia)->keys_last_known_state[0x11] = E64_sdl2_keyboard_state[0x24] != '\0';
    (machine.cia)->keys_last_known_state[0x12] = E64_sdl2_keyboard_state[0x25] != '\0';
    (machine.cia)->keys_last_known_state[0x13] = E64_sdl2_keyboard_state[0x26] != '\0';
    (machine.cia)->keys_last_known_state[0x14] = E64_sdl2_keyboard_state[0x27] != '\0';
    (machine.cia)->keys_last_known_state[0x15] = E64_sdl2_keyboard_state[0x2d] != '\0';
    (machine.cia)->keys_last_known_state[0x16] = E64_sdl2_keyboard_state[0x2e] != '\0';
    (machine.cia)->keys_last_known_state[0x17] = E64_sdl2_keyboard_state[0x2a] != '\0';
    (machine.cia)->keys_last_known_state[0x18] = E64_sdl2_keyboard_state[0x2b] != '\0';
    (machine.cia)->keys_last_known_state[0x19] = E64_sdl2_keyboard_state[0x14] != '\0';
    (machine.cia)->keys_last_known_state[0x1a] = E64_sdl2_keyboard_state[0x1a] != '\0';
    (machine.cia)->keys_last_known_state[0x1b] = E64_sdl2_keyboard_state[8] != '\0';
    (machine.cia)->keys_last_known_state[0x1c] = E64_sdl2_keyboard_state[0x15] != '\0';
    (machine.cia)->keys_last_known_state[0x1d] = E64_sdl2_keyboard_state[0x17] != '\0';
    (machine.cia)->keys_last_known_state[0x1e] = E64_sdl2_keyboard_state[0x1c] != '\0';
    (machine.cia)->keys_last_known_state[0x1f] = E64_sdl2_keyboard_state[0x18] != '\0';
    (machine.cia)->keys_last_known_state[0x20] = E64_sdl2_keyboard_state[0xc] != '\0';
    (machine.cia)->keys_last_known_state[0x21] = E64_sdl2_keyboard_state[0x12] != '\0';
    (machine.cia)->keys_last_known_state[0x22] = E64_sdl2_keyboard_state[0x13] != '\0';
    (machine.cia)->keys_last_known_state[0x23] = E64_sdl2_keyboard_state[0x2f] != '\0';
    (machine.cia)->keys_last_known_state[0x24] = E64_sdl2_keyboard_state[0x30] != '\0';
    (machine.cia)->keys_last_known_state[0x25] = E64_sdl2_keyboard_state[0x28] != '\0';
    (machine.cia)->keys_last_known_state[0x26] = E64_sdl2_keyboard_state[4] != '\0';
    (machine.cia)->keys_last_known_state[0x27] = E64_sdl2_keyboard_state[0x16] != '\0';
    (machine.cia)->keys_last_known_state[0x28] = E64_sdl2_keyboard_state[7] != '\0';
    (machine.cia)->keys_last_known_state[0x29] = E64_sdl2_keyboard_state[9] != '\0';
    (machine.cia)->keys_last_known_state[0x2a] = E64_sdl2_keyboard_state[10] != '\0';
    (machine.cia)->keys_last_known_state[0x2b] = E64_sdl2_keyboard_state[0xb] != '\0';
    (machine.cia)->keys_last_known_state[0x2c] = E64_sdl2_keyboard_state[0xd] != '\0';
    (machine.cia)->keys_last_known_state[0x2d] = E64_sdl2_keyboard_state[0xe] != '\0';
    (machine.cia)->keys_last_known_state[0x2e] = E64_sdl2_keyboard_state[0xf] != '\0';
    (machine.cia)->keys_last_known_state[0x2f] = E64_sdl2_keyboard_state[0x33] != '\0';
    (machine.cia)->keys_last_known_state[0x30] = E64_sdl2_keyboard_state[0x34] != '\0';
    (machine.cia)->keys_last_known_state[0x31] = E64_sdl2_keyboard_state[0x31] != '\0';
    (machine.cia)->keys_last_known_state[0x32] = E64_sdl2_keyboard_state[0xe1] != '\0';
    (machine.cia)->keys_last_known_state[0x33] = E64_sdl2_keyboard_state[0x1d] != '\0';
    (machine.cia)->keys_last_known_state[0x34] = E64_sdl2_keyboard_state[0x1b] != '\0';
    (machine.cia)->keys_last_known_state[0x35] = E64_sdl2_keyboard_state[6] != '\0';
    (machine.cia)->keys_last_known_state[0x36] = E64_sdl2_keyboard_state[0x19] != '\0';
    (machine.cia)->keys_last_known_state[0x37] = E64_sdl2_keyboard_state[5] != '\0';
    (machine.cia)->keys_last_known_state[0x38] = E64_sdl2_keyboard_state[0x11] != '\0';
    (machine.cia)->keys_last_known_state[0x39] = E64_sdl2_keyboard_state[0x10] != '\0';
    (machine.cia)->keys_last_known_state[0x3a] = E64_sdl2_keyboard_state[0x36] != '\0';
    (machine.cia)->keys_last_known_state[0x3b] = E64_sdl2_keyboard_state[0x37] != '\0';
    (machine.cia)->keys_last_known_state[0x3c] = E64_sdl2_keyboard_state[0x38] != '\0';
    (machine.cia)->keys_last_known_state[0x3d] = E64_sdl2_keyboard_state[0xe5] != '\0';
    (machine.cia)->keys_last_known_state[0x3e] = E64_sdl2_keyboard_state[0xe0] != '\0';
    (machine.cia)->keys_last_known_state[0x3f] = E64_sdl2_keyboard_state[0x2c] != '\0';
    (machine.cia)->keys_last_known_state[0x40] = E64_sdl2_keyboard_state[0xe4] != '\0';
    (machine.cia)->keys_last_known_state[0x41] = E64_sdl2_keyboard_state[0x50] != '\0';
    (machine.cia)->keys_last_known_state[0x42] = E64_sdl2_keyboard_state[0x52] != '\0';
    (machine.cia)->keys_last_known_state[0x43] = E64_sdl2_keyboard_state[0x51] != '\0';
    (machine.cia)->keys_last_known_state[0x44] = E64_sdl2_keyboard_state[0x4f] != '\0';
  }
  if (local_4 == -1) {
    printf("[SDL] detected quit event\n");
  }
  return local_4;
}

Assistant:

int E64::sdl2_process_events()
{
    int return_value = NO_EVENT;
    
    SDL_Event event;

    bool shift_pressed = E64_sdl2_keyboard_state[SDL_SCANCODE_LSHIFT] | E64_sdl2_keyboard_state[SDL_SCANCODE_RSHIFT];
    bool alt_pressed   = E64_sdl2_keyboard_state[SDL_SCANCODE_LALT]   | E64_sdl2_keyboard_state[SDL_SCANCODE_RALT];
    //bool gui_pressed   = E64_sdl2_keyboard_state[SDL_SCANCODE_LGUI]   | E64_sdl2_keyboard_state[SDL_SCANCODE_RGUI];

    while(SDL_PollEvent(&event))
    {
        switch(event.type)
        {
            case SDL_KEYDOWN:
                
                return_value = KEYPRESS_EVENT;          // default at keydown, may change to QUIT_EVENT
                
                if(event.key.keysym.sym == SDLK_F9)
                {
                    E64::sdl2_wait_until_f9_released();
			machine.toggle_mode();
                }
                else if( (event.key.keysym.sym == SDLK_f) && alt_pressed )
                {
                    E64::sdl2_wait_until_f_released();
                    host.video->toggle_fullscreen();
                }
                else if( (event.key.keysym.sym == SDLK_r) && alt_pressed )
                {
                    E64::sdl2_wait_until_r_released();
			machine.reset();
                    stats.reset();
                }
                else if( (event.key.keysym.sym == SDLK_q) && alt_pressed )
                {
                    E64::sdl2_wait_until_q_released();
                    return_value = QUIT_EVENT;
                }
                else if(machine.mode == RUNNING)
                {
                    if(event.key.keysym.sym == SDLK_F10)
                    {
			    machine.vicv->toggle_stats();
                    }
                }
                else if(machine.mode == MONITOR)
                {
                    switch(event.key.keysym.sym)
                    {
                        case SDLK_0:
                            monitor.tty->putchar(shift_pressed ? ')' : '0');
                            break;
                        case SDLK_1:
                            monitor.tty->putchar(shift_pressed ? '!' : '1');
                            break;
                        case SDLK_2:
                            monitor.tty->putchar(shift_pressed ? '@' : '2');
                            break;
                        case SDLK_3:
                            monitor.tty->putchar(shift_pressed ? '#' : '3');
                            break;
                        case SDLK_4:
                            monitor.tty->putchar(shift_pressed ? '$' : '4');
                            break;
                        case SDLK_5:
                            monitor.tty->putchar(shift_pressed ? '%' : '5');
                            break;
                        case SDLK_6:
                            monitor.tty->putchar(shift_pressed ? '^' : '6');
                            break;
                        case SDLK_7:
                            monitor.tty->putchar(shift_pressed ? '&' : '7');
                            break;
                        case SDLK_8:
                            monitor.tty->putchar(shift_pressed ? '*' : '8');
                            break;
                        case SDLK_9:
                            monitor.tty->putchar(shift_pressed ? '(' : '9');
                            break;
                        case SDLK_a:
                            monitor.tty->putchar(shift_pressed ? 'A' : 'a');
                            break;
                        case SDLK_b:
                            monitor.tty->putchar(shift_pressed ? 'B' : 'b');
                            break;
                        case SDLK_c:
                            monitor.tty->putchar(shift_pressed ? 'C' : 'c');
                            break;
                        case SDLK_d:
                            monitor.tty->putchar(shift_pressed ? 'D' : 'd');
                            break;
                        case SDLK_e:
                            monitor.tty->putchar(shift_pressed ? 'E' : 'e');
                            break;
                        case SDLK_f:
                            monitor.tty->putchar(shift_pressed ? 'F' : 'f');
                            break;
                        case SDLK_g:
                            monitor.tty->putchar(shift_pressed ? 'G' : 'g');
                            break;
                        case SDLK_h:
                            monitor.tty->putchar(shift_pressed ? 'H' : 'h');
                            break;
                        case SDLK_i:
                            monitor.tty->putchar(shift_pressed ? 'I' : 'i');
                            break;
                        case SDLK_j:
                            monitor.tty->putchar(shift_pressed ? 'J' : 'j');
                            break;
                        case SDLK_k:
                            monitor.tty->putchar(shift_pressed ? 'K' : 'k');
                            break;
                        case SDLK_l:
                            monitor.tty->putchar(shift_pressed ? 'L' : 'l');
                            break;
                        case SDLK_m:
                            monitor.tty->putchar(shift_pressed ? 'M' : 'm');
                            break;
                        case SDLK_n:
                            monitor.tty->putchar(shift_pressed ? 'N' : 'n');
                            break;
                        case SDLK_o:
                            monitor.tty->putchar(shift_pressed ? 'O' : 'o');
                            break;
                        case SDLK_p:
                            monitor.tty->putchar(shift_pressed ? 'P' : 'p');
                            break;
                        case SDLK_q:
                            monitor.tty->putchar(shift_pressed ? 'Q' : 'q');
                            break;
                        case SDLK_r:
                            monitor.tty->putchar(shift_pressed ? 'R' : 'r');
                            break;
                        case SDLK_s:
                            monitor.tty->putchar(shift_pressed ? 'S' : 's');
                            break;
                        case SDLK_t:
                            monitor.tty->putchar(shift_pressed ? 'T' : 't');
                            break;
                        case SDLK_u:
                            monitor.tty->putchar(shift_pressed ? 'U' : 'u');
                            break;
                        case SDLK_v:
                            monitor.tty->putchar(shift_pressed ? 'V' : 'v');
                            break;
                        case SDLK_w:
                            monitor.tty->putchar(shift_pressed ? 'W' : 'w');
                            break;
                        case SDLK_x:
                            monitor.tty->putchar(shift_pressed ? 'X' : 'x');
                            break;
                        case SDLK_y:
                            monitor.tty->putchar(shift_pressed ? 'Y' : 'y');
                            break;
                        case SDLK_z:
                            monitor.tty->putchar(shift_pressed ? 'Z' : 'z');
                            break;
                        case SDLK_SPACE:
                            monitor.tty->putchar(' ');
                            break;
                        case SDLK_BACKQUOTE:
                            monitor.tty->putchar(shift_pressed ? '~' : '`');
                            break;
                        case SDLK_COMMA:
                            monitor.tty->putchar(shift_pressed ? '<' : ',');
                            break;
                        case SDLK_PERIOD:
                            monitor.tty->putchar(shift_pressed ? '>' : '.');
                            break;
                        case SDLK_SLASH:
                            monitor.tty->putchar(shift_pressed ? '?' : '/');
                            break;
                        case SDLK_SEMICOLON:
                            monitor.tty->putchar(shift_pressed ? ':' : ';');
                            break;
                        case SDLK_QUOTE:
                            monitor.tty->putchar(shift_pressed ? '"' : '\'');
                            break;
                        case SDLK_BACKSLASH:
                            monitor.tty->putchar(shift_pressed ? '|' : '\\');
                            break;
                        case SDLK_LEFTBRACKET:
                            monitor.tty->putchar(shift_pressed ? '{' : '[');
                            break;
                        case SDLK_RIGHTBRACKET:
                            monitor.tty->putchar(shift_pressed ? '}' : ']');
                            break;
                        case SDLK_MINUS:
                            monitor.tty->putchar(shift_pressed ? '_' : '-');
                            break;
                        case SDLK_EQUALS:
                            monitor.tty->putchar(shift_pressed ? '+' : '=');
                            break;
                        case SDLK_RETURN:
				    monitor.tty->enter();
                            break;
                        case SDLK_BACKSPACE:
                            if(shift_pressed)
                            {
				    monitor.tty->insert();
                            }
                            else
                            {
				    monitor.tty->backspace();
                            }
                            break;
                        case SDLK_LEFT:
				    monitor.tty->arrow_left();
                            break;
                        case SDLK_RIGHT:
				    monitor.tty->arrow_right();
                            break;
                        case SDLK_UP:
				    monitor.tty->arrow_up();
                            break;
                        case SDLK_DOWN:
				    monitor.tty->arrow_down();
                            break;
                        case SDLK_F1:
				    monitor.command->single_step_cpu();
                            if (monitor.tty->status_bar_active == false) {
				    monitor.tty->cursor_deactivate();
				    monitor.command->dump_cpu_status();
				    monitor.tty->prompt();
				    monitor.tty->cursor_activate();
                            }
                            break;
                        case SDLK_F2:
				    monitor.tty->toggle_status_bar();
                            break;
                        case SDLK_F3:
				    monitor.tty->status_bar_hex_view = !monitor.tty->status_bar_hex_view;
                            break;
                    }
                }
                break;
            case SDL_WINDOWEVENT:
                if(event.window.event == SDL_WINDOWEVENT_RESIZED)
                {
                    printf("[SDL] window resize event\n");
                }
                break;
            case SDL_DROPFILE:
			machine.fd->insert_disk(event.drop.file, false, false);
                SDL_free(event.drop.file);
		break;
            case SDL_QUIT:
                return_value = QUIT_EVENT;
                break;
        }
    }

    // update keystates in cia chip, regardless if machine is in debug or running mode
    if( !alt_pressed )
    {
	    machine.cia->keys_last_known_state[SCANCODE_ESCAPE] = E64_sdl2_keyboard_state[SDL_SCANCODE_ESCAPE] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_F1] = E64_sdl2_keyboard_state[SDL_SCANCODE_F1] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_F2] = E64_sdl2_keyboard_state[SDL_SCANCODE_F2] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_F3] = E64_sdl2_keyboard_state[SDL_SCANCODE_F3] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_F4] = E64_sdl2_keyboard_state[SDL_SCANCODE_F4] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_F5] = E64_sdl2_keyboard_state[SDL_SCANCODE_F5] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_F6] = E64_sdl2_keyboard_state[SDL_SCANCODE_F6] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_F7] = E64_sdl2_keyboard_state[SDL_SCANCODE_F7] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_F8] = E64_sdl2_keyboard_state[SDL_SCANCODE_F8] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_GRAVE] = (machine.cia->registers[SCANCODE_GRAVE] << 1) | (E64_sdl2_keyboard_state[SDL_SCANCODE_GRAVE] ? 0x01 : 0x00);
	    machine.cia->keys_last_known_state[SCANCODE_1] = E64_sdl2_keyboard_state[SDL_SCANCODE_1] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_2] = E64_sdl2_keyboard_state[SDL_SCANCODE_2] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_3] = E64_sdl2_keyboard_state[SDL_SCANCODE_3] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_4] = E64_sdl2_keyboard_state[SDL_SCANCODE_4] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_5] = E64_sdl2_keyboard_state[SDL_SCANCODE_5] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_6] = E64_sdl2_keyboard_state[SDL_SCANCODE_6] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_7] = E64_sdl2_keyboard_state[SDL_SCANCODE_7] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_8] = E64_sdl2_keyboard_state[SDL_SCANCODE_8] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_9] = E64_sdl2_keyboard_state[SDL_SCANCODE_9] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_0] = E64_sdl2_keyboard_state[SDL_SCANCODE_0] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_MINUS] = E64_sdl2_keyboard_state[SDL_SCANCODE_MINUS] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_EQUALS] = E64_sdl2_keyboard_state[SDL_SCANCODE_EQUALS] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_BACKSPACE] = E64_sdl2_keyboard_state[SDL_SCANCODE_BACKSPACE] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_TAB] = E64_sdl2_keyboard_state[SDL_SCANCODE_TAB] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_Q] = E64_sdl2_keyboard_state[SDL_SCANCODE_Q] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_W] = E64_sdl2_keyboard_state[SDL_SCANCODE_W] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_E] = E64_sdl2_keyboard_state[SDL_SCANCODE_E] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_R] = E64_sdl2_keyboard_state[SDL_SCANCODE_R] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_T] = E64_sdl2_keyboard_state[SDL_SCANCODE_T] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_Y] = E64_sdl2_keyboard_state[SDL_SCANCODE_Y] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_U] = E64_sdl2_keyboard_state[SDL_SCANCODE_U] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_I] = E64_sdl2_keyboard_state[SDL_SCANCODE_I] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_O] = E64_sdl2_keyboard_state[SDL_SCANCODE_O] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_P] = E64_sdl2_keyboard_state[SDL_SCANCODE_P] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_LEFTBRACKET] = E64_sdl2_keyboard_state[SDL_SCANCODE_LEFTBRACKET] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_RIGHTBRACKET] = E64_sdl2_keyboard_state[SDL_SCANCODE_RIGHTBRACKET] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_RETURN] = E64_sdl2_keyboard_state[SDL_SCANCODE_RETURN] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_A] = E64_sdl2_keyboard_state[SDL_SCANCODE_A] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_S] = E64_sdl2_keyboard_state[SDL_SCANCODE_S] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_D] = E64_sdl2_keyboard_state[SDL_SCANCODE_D] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_F] = E64_sdl2_keyboard_state[SDL_SCANCODE_F] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_G] = E64_sdl2_keyboard_state[SDL_SCANCODE_G] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_H] = E64_sdl2_keyboard_state[SDL_SCANCODE_H] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_J] = E64_sdl2_keyboard_state[SDL_SCANCODE_J] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_K] = E64_sdl2_keyboard_state[SDL_SCANCODE_K] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_L] = E64_sdl2_keyboard_state[SDL_SCANCODE_L] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_SEMICOLON] = E64_sdl2_keyboard_state[SDL_SCANCODE_SEMICOLON] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_APOSTROPHE] = E64_sdl2_keyboard_state[SDL_SCANCODE_APOSTROPHE] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_BACKSLASH] = E64_sdl2_keyboard_state[SDL_SCANCODE_BACKSLASH] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_LSHIFT] = E64_sdl2_keyboard_state[SDL_SCANCODE_LSHIFT] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_Z] = E64_sdl2_keyboard_state[SDL_SCANCODE_Z] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_X] = E64_sdl2_keyboard_state[SDL_SCANCODE_X] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_C] = E64_sdl2_keyboard_state[SDL_SCANCODE_C] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_V] = E64_sdl2_keyboard_state[SDL_SCANCODE_V] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_B] = E64_sdl2_keyboard_state[SDL_SCANCODE_B] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_N] = E64_sdl2_keyboard_state[SDL_SCANCODE_N] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_M] = E64_sdl2_keyboard_state[SDL_SCANCODE_M] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_COMMA] = E64_sdl2_keyboard_state[SDL_SCANCODE_COMMA] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_PERIOD] = E64_sdl2_keyboard_state[SDL_SCANCODE_PERIOD] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_SLASH] = E64_sdl2_keyboard_state[SDL_SCANCODE_SLASH] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_RSHIFT] = E64_sdl2_keyboard_state[SDL_SCANCODE_RSHIFT] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_LCTRL] = E64_sdl2_keyboard_state[SDL_SCANCODE_LCTRL] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_SPACE] = E64_sdl2_keyboard_state[SDL_SCANCODE_SPACE] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_RCTRL] = E64_sdl2_keyboard_state[SDL_SCANCODE_RCTRL] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_LEFT] = E64_sdl2_keyboard_state[SDL_SCANCODE_LEFT] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_UP] = E64_sdl2_keyboard_state[SDL_SCANCODE_UP] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_DOWN] = E64_sdl2_keyboard_state[SDL_SCANCODE_DOWN] ? 0x01 : 0x00;
	    machine.cia->keys_last_known_state[SCANCODE_RIGHT] = E64_sdl2_keyboard_state[SDL_SCANCODE_RIGHT] ? 0x01 : 0x00;
	}
	if (return_value == QUIT_EVENT)
		printf("[SDL] detected quit event\n");
	return return_value;
}